

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlBase64.c
# Opt level: O0

JL_STATUS JlBase64Encode(void *Data,size_t DataSize,char **pBase64String)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong local_80;
  size_t i_1;
  size_t i;
  char charBlock [4];
  ulong uStack_68;
  uint8_t byteBlock [3];
  size_t blockIndex;
  size_t outIndex;
  char *string;
  size_t stringLength;
  size_t numExtraChars;
  size_t numTrailingBytes;
  size_t numCompleteBlocks;
  uint8_t *dataBytes;
  JL_STATUS jlStatus;
  char **pBase64String_local;
  size_t DataSize_local;
  void *Data_local;
  
  if (((Data == (void *)0x0) || (DataSize == 0)) || (pBase64String == (char **)0x0)) {
    dataBytes._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    *pBase64String = (char *)0x0;
    uVar1 = DataSize / 3;
    uVar3 = DataSize % 3;
    stringLength = 0;
    string = (char *)(uVar1 * 4);
    if (uVar3 != 0) {
      stringLength = uVar3 + 1;
      string = string + stringLength;
    }
    pcVar2 = (char *)WjTestLib_Calloc((size_t)(string + 1),1);
    if (pcVar2 == (char *)0x0) {
      dataBytes._4_4_ = JL_STATUS_OUT_OF_MEMORY;
    }
    else {
      blockIndex = 0;
      for (uStack_68 = 0; uStack_68 < uVar1; uStack_68 = uStack_68 + 1) {
        Encode3BytesToBase64((uint8_t *)((long)Data + uStack_68 * 3),pcVar2 + blockIndex);
        blockIndex = blockIndex + 4;
      }
      if (uVar3 != 0) {
        memset((void *)((long)&i + 5),0,3);
        memset((void *)((long)&i + 1),0,4);
        for (i_1 = 0; i_1 < uVar3; i_1 = i_1 + 1) {
          *(undefined1 *)((long)&i + i_1 + 5) = *(undefined1 *)((long)Data + uVar1 * 3 + i_1);
        }
        Encode3BytesToBase64((uint8_t *)((long)&i + 5),(char *)((long)&i + 1));
        for (local_80 = 0; local_80 < stringLength; local_80 = local_80 + 1) {
          pcVar2[blockIndex] = *(char *)((long)&i + local_80 + 1);
          blockIndex = blockIndex + 1;
        }
      }
      *pBase64String = pcVar2;
      dataBytes._4_4_ = JL_STATUS_SUCCESS;
    }
  }
  return dataBytes._4_4_;
}

Assistant:

JL_STATUS
    JlBase64Encode
    (
        void const*         Data,
        size_t              DataSize,
        char**              pBase64String
    )
{
    JL_STATUS jlStatus;

    if(     NULL != Data
        &&  0 != DataSize
        &&  NULL != pBase64String )
    {
        uint8_t const* dataBytes = Data;
        *pBase64String = NULL;

        size_t numCompleteBlocks = DataSize / 3;
        size_t numTrailingBytes = DataSize % 3;
        size_t numExtraChars = 0;

        // Calculate size of string needed
        size_t stringLength = numCompleteBlocks * 4;
        if( numTrailingBytes > 0 )
        {
            numExtraChars = numTrailingBytes + 1;
            stringLength += numExtraChars;
        }

        // Allocate string (one larger for the zero terminator)
        char* string = JlAlloc( stringLength + 1 );
        if( NULL != string )
        {
            // Process in blocks of 3 input bytes at a time
            size_t outIndex = 0;
            for( size_t blockIndex=0; blockIndex<numCompleteBlocks; blockIndex+=1 )
            {
                Encode3BytesToBase64( dataBytes + (blockIndex*3), string + outIndex );
                outIndex += 4;
            }

            if( numTrailingBytes > 0 )
            {
                // Process the final partial block
                uint8_t byteBlock[3] = {0};
                char charBlock[4] = {0};
                for( size_t i=0; i<numTrailingBytes; i++ )
                {
                    byteBlock[i] = dataBytes[ (numCompleteBlocks*3) + i ];
                }
                Encode3BytesToBase64( byteBlock, charBlock );

                // Now copy out the required number of characters
                for( size_t i=0; i<numExtraChars; i++ )
                {
                    string[outIndex] = charBlock[i];
                    outIndex += 1;
                }
            }

            *pBase64String = string;

            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_OUT_OF_MEMORY;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}